

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O2

WordType llvm::APInt::tcSubtractPart(WordType *dst,WordType src,uint parts)

{
  ulong *puVar1;
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  
  uVar2 = 0;
  do {
    uVar3 = uVar2;
    if (parts == uVar3) break;
    puVar1 = dst + uVar3;
    bVar4 = *puVar1 < src;
    *puVar1 = *puVar1 - src;
    src = 1;
    uVar2 = uVar3 + 1;
  } while (bVar4);
  return (ulong)(parts <= uVar3);
}

Assistant:

APInt::WordType APInt::tcSubtractPart(WordType *dst, WordType src,
                                      unsigned parts) {
  for (unsigned i = 0; i < parts; ++i) {
    WordType Dst = dst[i];
    dst[i] -= src;
    if (src <= Dst)
      return 0; // No need to borrow so exit early.
    src = 1; // We have to "borrow 1" from next "word"
  }

  return 1;
}